

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_null_implementation.cpp
# Opt level: O0

hrgls_Status __thiscall hrgls::API::SetVerbosity(API *this,uint16_t verbosity)

{
  ostream *poVar1;
  uint16_t verbosity_local;
  API *this_local;
  
  if (this->m_private == (API_private *)0x0) {
    this_local._4_4_ = 0x3ee;
  }
  else {
    this->m_private->verbosity = verbosity;
    if (200 < this->m_private->verbosity) {
      poVar1 = std::operator<<((ostream *)&std::cout,"API::SetVerbosity(): New verbosity: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,verbosity);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

hrgls_Status API::SetVerbosity(uint16_t verbosity)
  {
    if (!m_private) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    m_private->verbosity = verbosity;
    if (m_private->verbosity > 200) {
      std::cout << "API::SetVerbosity(): New verbosity: " << verbosity << std::endl;
    }
    return hrgls_STATUS_OKAY;
  }